

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertCompare
          (UtestShell *this,bool comparison,char *checkString,char *comparisonString,char *text,
          char *fileName,size_t lineNumber,TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  byte in_SIL;
  long *in_RDI;
  SimpleString *in_R9;
  undefined8 in_stack_00000010;
  UtestShell *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff28;
  SimpleString *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  UtestShell *in_stack_ffffffffffffff48;
  ComparisonFailure *in_stack_ffffffffffffff50;
  SimpleString *in_stack_ffffffffffffff60;
  undefined1 local_98 [104];
  SimpleString *local_30;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_30 = in_R9;
  pTVar1 = getTestResult(in_stack_ffffffffffffff08);
  (*pTVar1->_vptr_TestResult[10])();
  if ((local_9 & 1) == 0) {
    SimpleString::SimpleString(local_30,(char *)in_stack_ffffffffffffff08);
    SimpleString::SimpleString(local_30,(char *)in_stack_ffffffffffffff08);
    SimpleString::SimpleString(local_30,(char *)in_stack_ffffffffffffff08);
    ComparisonFailure::ComparisonFailure
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff60);
    (**(code **)(*in_RDI + 0x138))(in_RDI,local_98,in_stack_00000010);
    ComparisonFailure::~ComparisonFailure((ComparisonFailure *)0x123b42);
    SimpleString::~SimpleString((SimpleString *)0x123b4c);
    SimpleString::~SimpleString((SimpleString *)0x123b56);
    SimpleString::~SimpleString((SimpleString *)0x123b60);
  }
  return;
}

Assistant:

void UtestShell::assertCompare(bool comparison, const char *checkString, const char *comparisonString, const char *text, const char *fileName, size_t lineNumber, const TestTerminator &testTerminator)
{
    getTestResult()->countCheck();
    if (!comparison)
        failWith(ComparisonFailure(this, fileName, lineNumber, checkString, comparisonString, text), testTerminator);
}